

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

void __thiscall
google::protobuf::io::FileOutputStream::FileOutputStream
          (FileOutputStream *this,int file_descriptor,int block_size)

{
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__FileOutputStream_00620250;
  (this->copying_output_).super_CopyingOutputStream._vptr_CopyingOutputStream =
       (_func_int **)&PTR__CopyingFileOutputStream_00620298;
  (this->copying_output_).file_ = file_descriptor;
  (this->copying_output_).close_on_delete_ = false;
  (this->copying_output_).is_closed_ = false;
  (this->copying_output_).errno_ = 0;
  CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
            (&this->impl_,&(this->copying_output_).super_CopyingOutputStream,block_size);
  return;
}

Assistant:

FileOutputStream::FileOutputStream(int file_descriptor, int block_size)
    : copying_output_(file_descriptor), impl_(&copying_output_, block_size) {}